

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O3

void tile_mt_queue(AV1Decoder *pbi,int tile_cols,int tile_rows,int tile_rows_start,int tile_rows_end
                  ,int tile_cols_start,int tile_cols_end,int start_tile,int end_tile)

{
  size_t size;
  pthread_mutex_t *ppVar1;
  TileJobsDec *pTVar2;
  int iVar3;
  size_t sVar4;
  TileJobsDec *pTVar5;
  uint uVar6;
  ulong __nmemb;
  long lVar7;
  long lVar8;
  TileBufferDec *pTVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  TileBufferDec *pTVar13;
  long lVar14;
  
  if (((pbi->tile_mt_info).alloc_tile_cols != tile_cols) ||
     ((pbi->tile_mt_info).alloc_tile_rows != tile_rows)) {
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
    (pbi->tile_mt_info).alloc_tile_rows = tile_rows;
    (pbi->tile_mt_info).alloc_tile_cols = tile_cols;
    iVar3 = tile_rows * tile_cols;
    size = (long)iVar3 * 0x28;
    ppVar1 = (pthread_mutex_t *)aom_malloc(size);
    (pbi->tile_mt_info).job_mutex = ppVar1;
    if (ppVar1 == (pthread_mutex_t *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tile_mt_info->job_mutex");
    }
    if (0 < iVar3) {
      sVar4 = 0;
      do {
        pthread_mutex_init((pthread_mutex_t *)((long)(pbi->tile_mt_info).job_mutex + sVar4),
                           (pthread_mutexattr_t *)0x0);
        sVar4 = sVar4 + 0x28;
      } while (size != sVar4);
    }
    pTVar2 = (TileJobsDec *)aom_malloc((long)iVar3 << 4);
    (pbi->tile_mt_info).job_queue = pTVar2;
    if (pTVar2 == (TileJobsDec *)0x0) {
      aom_internal_error((pbi->common).error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate tile_mt_info->job_queue");
    }
  }
  pTVar2 = (pbi->tile_mt_info).job_queue;
  (pbi->tile_mt_info).jobs_enqueued = 0;
  (pbi->tile_mt_info).jobs_dequeued = 0;
  __nmemb = 0;
  if (tile_rows_start < tile_rows_end) {
    lVar10 = (long)tile_cols_start;
    lVar7 = (long)tile_rows_start;
    lVar8 = lVar7 * 0x53a0;
    pTVar9 = pbi->tile_buffers[lVar7] + lVar10;
    pTVar5 = pTVar2;
    do {
      if (tile_cols_start < tile_cols_end) {
        lVar11 = (long)(pbi->common).tiles.cols;
        lVar14 = lVar8 * lVar11 + lVar10 * 0x53a0;
        lVar12 = lVar11 * lVar7 + lVar10;
        lVar11 = tile_cols_end - lVar10;
        pTVar13 = pTVar9;
        do {
          if (lVar12 <= end_tile && start_tile <= lVar12) {
            pTVar5->tile_buffer = pTVar13;
            pTVar5->tile_data =
                 (TileDataDec *)((long)((pbi->tile_data->tctx).txb_skip_cdf + -2) + 0x3c + lVar14);
            pTVar5 = pTVar5 + 1;
            uVar6 = (int)__nmemb + 1;
            __nmemb = (ulong)uVar6;
            (pbi->tile_mt_info).jobs_enqueued = uVar6;
          }
          lVar14 = lVar14 + 0x53a0;
          pTVar13 = pTVar13 + 1;
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x53a0;
      pTVar9 = pTVar9 + 0x40;
    } while (lVar7 != tile_rows_end);
    __nmemb = (ulong)(int)__nmemb;
  }
  qsort(pTVar2,__nmemb,0x10,compare_tile_buffers);
  return;
}

Assistant:

static inline void tile_mt_queue(AV1Decoder *pbi, int tile_cols, int tile_rows,
                                 int tile_rows_start, int tile_rows_end,
                                 int tile_cols_start, int tile_cols_end,
                                 int start_tile, int end_tile) {
  AV1_COMMON *const cm = &pbi->common;
  if (pbi->tile_mt_info.alloc_tile_cols != tile_cols ||
      pbi->tile_mt_info.alloc_tile_rows != tile_rows) {
    av1_dealloc_dec_jobs(&pbi->tile_mt_info);
    alloc_dec_jobs(&pbi->tile_mt_info, cm, tile_rows, tile_cols);
  }
  enqueue_tile_jobs(pbi, cm, tile_rows_start, tile_rows_end, tile_cols_start,
                    tile_cols_end, start_tile, end_tile);
  qsort(pbi->tile_mt_info.job_queue, pbi->tile_mt_info.jobs_enqueued,
        sizeof(pbi->tile_mt_info.job_queue[0]), compare_tile_buffers);
}